

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

void __thiscall
flatbuffers::FlatCompiler::ParseFile
          (FlatCompiler *this,Parser *parser,string *filename,string *contents,
          vector<const_char_*,_std::allocator<const_char_*>_> *include_directories)

{
  bool bVar1;
  char *source;
  reference include_paths;
  char *source_filename;
  ulong uVar2;
  value_type local_b0;
  value_type local_a8;
  char **local_a0;
  char **local_88;
  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_80;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_78;
  const_iterator local_70;
  undefined1 local_68 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> inc_directories;
  string local_include_directory;
  vector<const_char_*,_std::allocator<const_char_*>_> *include_directories_local;
  string *contents_local;
  string *filename_local;
  Parser *parser_local;
  FlatCompiler *this_local;
  
  StripFileName((string *)
                &inc_directories.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,filename);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68);
  local_78._M_current =
       (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68);
  __gnu_cxx::
  __normal_iterator<char_const*const*,std::vector<char_const*,std::allocator<char_const*>>>::
  __normal_iterator<char_const**>
            ((__normal_iterator<char_const*const*,std::vector<char_const*,std::allocator<char_const*>>>
              *)&local_70,&local_78);
  local_80._M_current =
       (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(include_directories)
  ;
  local_88 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                                (include_directories);
  local_a0 = (char **)std::vector<char_const*,std::allocator<char_const*>>::
                      insert<__gnu_cxx::__normal_iterator<char_const*const*,std::vector<char_const*,std::allocator<char_const*>>>,void>
                                ((vector<char_const*,std::allocator<char_const*>> *)local_68,
                                 local_70,local_80,
                                 (__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                  )local_88);
  local_a8 = (value_type)std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68,&local_a8);
  local_b0 = (value_type)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68,&local_b0);
  source = (char *)std::__cxx11::string::c_str();
  include_paths =
       std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68,0);
  source_filename = (char *)std::__cxx11::string::c_str();
  bVar1 = Parser::Parse(parser,source,include_paths,source_filename);
  if (!bVar1) {
    Error(this,&parser->error_,false,false);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Warn(this,&parser->error_,false);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68);
  std::__cxx11::string::~string
            ((string *)
             &inc_directories.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void FlatCompiler::ParseFile(
    flatbuffers::Parser &parser, const std::string &filename,
    const std::string &contents,
    const std::vector<const char *> &include_directories) const {
  auto local_include_directory = flatbuffers::StripFileName(filename);

  std::vector<const char *> inc_directories;
  inc_directories.insert(inc_directories.end(), include_directories.begin(),
                         include_directories.end());
  inc_directories.push_back(local_include_directory.c_str());
  inc_directories.push_back(nullptr);

  if (!parser.Parse(contents.c_str(), &inc_directories[0], filename.c_str())) {
    Error(parser.error_, false, false);
  }
  if (!parser.error_.empty()) { Warn(parser.error_, false); }
}